

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

void Curl_conn_get_host(Curl_easy *data,int sockindex,char **phost,char **pdisplay_host,int *pport)

{
  Curl_cfilter *pCVar1;
  
  pCVar1 = data->conn->cfilter[sockindex];
  if (pCVar1 != (Curl_cfilter *)0x0) {
    (*pCVar1->cft->get_host)(pCVar1,data,phost,pdisplay_host,pport);
    return;
  }
  *phost = (data->conn->host).name;
  *pdisplay_host = (data->conn->host).dispname;
  *pport = data->conn->remote_port;
  return;
}

Assistant:

void Curl_conn_get_host(struct Curl_easy *data, int sockindex,
                        const char **phost, const char **pdisplay_host,
                        int *pport)
{
  struct Curl_cfilter *cf;

  DEBUGASSERT(data->conn);
  cf = data->conn->cfilter[sockindex];
  if(cf) {
    cf->cft->get_host(cf, data, phost, pdisplay_host, pport);
  }
  else {
    /* Some filter ask during shutdown for this, mainly for debugging
     * purposes. We hand out the defaults, however this is not always
     * accurate, as the connection might be tunneled, etc. But all that
     * state is already gone here. */
    *phost = data->conn->host.name;
    *pdisplay_host = data->conn->host.dispname;
    *pport = data->conn->remote_port;
  }
}